

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall
ExprWriterTest_UnaryExprPrecedence_Test::TestBody(ExprWriterTest_UnaryExprPrecedence_Test *this)

{
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  *this_00;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *pBVar1;
  ExprWriterTest_UnaryExprPrecedence_Test *pEVar2;
  bool bVar3;
  Impl *pIVar4;
  Impl *pIVar5;
  char *pcVar6;
  AssertionResult gtest_ar;
  AssertHelper local_80;
  string local_78;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  Impl *local_48;
  ExprWriterTest_UnaryExprPrecedence_Test *local_40;
  Impl *local_38;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory.exprs_;
  local_78._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_78);
  pIVar4 = (Impl *)operator_new__(0x40);
  pIVar4->kind_ = FIRST_REFERENCE;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  pIVar4[1].kind_ = UNKNOWN;
  local_80.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_80);
  pIVar5 = (Impl *)operator_new__(0x80);
  pIVar5->kind_ = FIRST_UNARY;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5;
  *(Impl **)(pIVar5 + 2) = pIVar4;
  local_80.data_ = (AssertHelperData *)0x0;
  local_48 = pIVar4;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_80);
  local_38 = (Impl *)operator_new__(0x80);
  local_38->kind_ = FIRST_UNARY;
  pBVar1 = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
           (this->super_ExprWriterTest).super_ExprFactory.exprs_.
           super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar1[-1].super_ExprBase.impl_ = local_38;
  *(Impl **)(local_38 + 2) = pIVar5;
  local_40 = this;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_78,(fmt *)0x1674c5,(CStringRef)&local_38,pBVar1);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (local_58,"\"--x1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeUnary(ex::MINUS, MakeUnary(ex::MINUS, x1))))"
             ,(char (*) [5])"--x1",&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x1b2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_80);
  pIVar4 = (Impl *)operator_new__(0xc0);
  pEVar2 = local_40;
  pIVar4->kind_ = POW;
  (local_40->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  *(Impl **)(pIVar4 + 2) = local_48;
  *(Impl **)(pIVar4 + 4) = local_48;
  local_80.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_80);
  local_38 = (Impl *)operator_new__(0x80);
  local_38->kind_ = FIRST_UNARY;
  pBVar1 = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
           (pEVar2->super_ExprWriterTest).super_ExprFactory.exprs_.
           super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar1[-1].super_ExprBase.impl_ = local_38;
  *(Impl **)(local_38 + 2) = pIVar4;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_78,(fmt *)0x1674c5,(CStringRef)&local_38,pBVar1);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            (local_58,"\"-(x1 ^ x1)\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeUnary(ex::MINUS, MakeBinary(ex::POW, x1, x1))))"
             ,(char (*) [11])"-(x1 ^ x1)",&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x1b3,pcVar6);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprWriterTest, UnaryExprPrecedence) {
  auto x1 = MakeVariable(0);
  CHECK_WRITE("--x1", MakeUnary(ex::MINUS, MakeUnary(ex::MINUS, x1)));
  CHECK_WRITE("-(x1 ^ x1)", MakeUnary(ex::MINUS, MakeBinary(ex::POW, x1, x1)));
}